

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O3

void __thiscall restincurl::Signaler::Signaler(Signaler *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  SystemException *this_00;
  long lVar4;
  string local_48;
  
  iVar2 = pipe((int *)this);
  if (iVar2 == 0) {
    lVar4 = 0;
    do {
      iVar2 = *(int *)((long)(this->pipefd_)._M_elems + lVar4);
      uVar3 = fcntl(iVar2,3,0);
      uVar1 = uVar3 | 0x800;
      if (uVar3 == 0xffffffff) {
        uVar1 = 0x800;
      }
      fcntl(iVar2,4,(ulong)uVar1);
      lVar4 = lVar4 + 4;
    } while (lVar4 != 8);
    return;
  }
  this_00 = (SystemException *)__cxa_allocate_exception(0x18);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"pipe","");
  SystemException::SystemException(this_00,&local_48,iVar2);
  __cxa_throw(this_00,&SystemException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Signaler() {
            auto status = pipe(pipefd_.data());
            if (status) {
                throw SystemException("pipe", status);
            }
            for(auto fd : pipefd_) {
                int flags = 0;
                if (-1 == (flags = fcntl(fd, F_GETFL, 0)))
                    flags = 0;
                fcntl(fd, F_SETFL, flags | O_NONBLOCK);
            }
        }